

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(SupportVectorClassifier *a,SupportVectorClassifier *b)

{
  uint32 uVar1;
  bool bVar2;
  SparseSupportVectors *pSVar3;
  SparseSupportVectors *pSVar4;
  DenseSupportVectors *pDVar5;
  DenseSupportVectors *pDVar6;
  StringVector *a_00;
  StringVector *b_00;
  Int64Vector *a_01;
  Int64Vector *b_01;
  Kernel *b_02;
  Kernel *a_02;
  
  a_02 = a->kernel_;
  if (a_02 == (Kernel *)0x0) {
    a_02 = (Kernel *)&_Kernel_default_instance_;
  }
  b_02 = b->kernel_;
  if (b_02 == (Kernel *)0x0) {
    b_02 = (Kernel *)&_Kernel_default_instance_;
  }
  bVar2 = operator!=(a_02,b_02);
  if (bVar2) {
    return false;
  }
  bVar2 = operator!=(&a->numberofsupportvectorsperclass_,&b->numberofsupportvectorsperclass_);
  if (bVar2) {
    return false;
  }
  bVar2 = operator!=(&a->coefficients_,&b->coefficients_);
  if (bVar2) {
    return false;
  }
  bVar2 = operator!=(&a->rho_,&b->rho_);
  if (bVar2) {
    return false;
  }
  bVar2 = operator!=(&a->proba_,&b->proba_);
  if (bVar2) {
    return false;
  }
  bVar2 = operator!=(&a->probb_,&b->probb_);
  if (bVar2) {
    return false;
  }
  uVar1 = a->_oneof_case_[0];
  if (uVar1 != b->_oneof_case_[0]) {
    return false;
  }
  if (uVar1 == 4) {
    pDVar5 = SupportVectorClassifier::densesupportvectors(a);
    pDVar6 = SupportVectorClassifier::densesupportvectors(b);
    bVar2 = operator!=(&pDVar5->vectors_,&pDVar6->vectors_);
  }
  else {
    if (uVar1 != 3) goto LAB_00581434;
    pSVar3 = SupportVectorClassifier::sparsesupportvectors(a);
    pSVar4 = SupportVectorClassifier::sparsesupportvectors(b);
    bVar2 = operator!=(&pSVar3->vectors_,&pSVar4->vectors_);
  }
  if (bVar2 != false) {
    return false;
  }
LAB_00581434:
  uVar1 = a->_oneof_case_[1];
  if (uVar1 != b->_oneof_case_[1]) {
    return false;
  }
  if (uVar1 != 0) {
    if (uVar1 == 100) {
      a_00 = SupportVectorClassifier::stringclasslabels(a);
      b_00 = SupportVectorClassifier::stringclasslabels(b);
      bVar2 = vectorsEqual<CoreML::Specification::StringVector>(a_00,b_00);
      return bVar2;
    }
    a_01 = SupportVectorClassifier::int64classlabels(a);
    b_01 = SupportVectorClassifier::int64classlabels(b);
    bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>(a_01,b_01);
    return bVar2;
  }
  return true;
}

Assistant:

bool operator==(const SupportVectorClassifier& a,
                        const SupportVectorClassifier& b) {
            if (a.kernel() != b.kernel()) {
                return false;
            }
            if (a.numberofsupportvectorsperclass() != b.numberofsupportvectorsperclass()) {
                return false;
            }
            if (a.coefficients() != b.coefficients()) {
                return false;
            }
            if (a.rho() != b.rho()) {
                return false;
            }
            if (a.proba() != b.proba()) {
                return false;
            }
            if (a.probb() != b.probb()) {
                return false;
            }
            if (a.supportVectors_case() != b.supportVectors_case()) {
                return false;
            }
            switch (a.supportVectors_case()) {
                case SupportVectorClassifier::kSparseSupportVectors:
                    if (a.sparsesupportvectors().vectors() != b.sparsesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::kDenseSupportVectors:
                    if (a.densesupportvectors().vectors() != b.densesupportvectors().vectors()) {
                        return false;
                    }
                    break;
                case SupportVectorClassifier::SUPPORTVECTORS_NOT_SET:
                    break;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case SupportVectorClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case SupportVectorClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case SupportVectorClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }